

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int lnsrch(custom_function *funcpt,double *xi,double *jac,double *p,int N,double *dx,double maxstep,
          double stol,double *x)

{
  double dVar1;
  double *C;
  double *A;
  double *B;
  double *C_00;
  double *array;
  double *B_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pl;
  double *rcheck;
  double *ab;
  double *temp2;
  double *temp1;
  double *slopei;
  double nlen;
  double rell;
  double den;
  double ll;
  double lambdaprev2;
  double lambda2;
  double funcprev;
  double lambdatemp;
  double lambdaprev;
  double funci;
  double funcf;
  double lambdamin;
  double lambda;
  double alpha;
  int MAXITER;
  int iter;
  int i;
  int retval;
  double stol_local;
  double maxstep_local;
  double *dx_local;
  int N_local;
  double *p_local;
  double *jac_local;
  double *xi_local;
  custom_function *funcpt_local;
  
  C = (double *)malloc(8);
  A = (double *)malloc(0x20);
  B = (double *)malloc(0x10);
  C_00 = (double *)malloc(0x10);
  array = (double *)malloc((long)N << 3);
  B_00 = (double *)malloc((long)N << 3);
  iter = 100;
  lambdamin = 1.0;
  slopei = (double *)0x0;
  lambda2 = 1.0;
  lambdatemp = 1.0;
  for (MAXITER = 0; MAXITER < N; MAXITER = MAXITER + 1) {
    slopei = (double *)(dx[MAXITER] * p[MAXITER] * dx[MAXITER] * p[MAXITER] + (double)slopei);
  }
  dVar2 = sqrt((double)slopei);
  alpha._4_4_ = 0;
  if (maxstep < dVar2) {
    scale(p,1,N,maxstep / dVar2);
  }
  mmult(jac,p,C,1,N,1);
  for (MAXITER = 0; MAXITER < N; MAXITER = MAXITER + 1) {
    if (ABS(xi[MAXITER]) <= 1.0 / ABS(dx[MAXITER])) {
      rell = 1.0 / ABS(dx[MAXITER]);
    }
    else {
      rell = ABS(xi[MAXITER]);
    }
    array[MAXITER] = p[MAXITER] / rell;
  }
  dVar2 = array_max_abs(array,N);
  dVar3 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if ((1.79769313486232e+308 <= dVar3) || (dVar3 <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    free(C);
    free(A);
    free(B);
    free(C_00);
    free(array);
    free(B_00);
    funcpt_local._4_4_ = 0xf;
  }
  else if (NAN(dVar3)) {
    printf("Program Exiting as the function returns NaN");
    free(C);
    free(A);
    free(B);
    free(C_00);
    free(array);
    free(B_00);
    funcpt_local._4_4_ = 0xf;
  }
  else {
    while (1 < (uint)iter && alpha._4_4_ < 1000) {
      alpha._4_4_ = alpha._4_4_ + 1;
      for (MAXITER = 0; MAXITER < N; MAXITER = MAXITER + 1) {
        B_00[MAXITER] = p[MAXITER] * lambdamin;
      }
      madd(xi,B_00,x,1,N);
      dVar4 = (*funcpt->funcpt)(x,N,funcpt->params);
      if ((1.79769313486232e+308 <= dVar4) || (dVar4 <= -1.79769313486232e+308)) {
        printf("Program Exiting as the function value exceeds the maximum double value");
        free(C);
        free(A);
        free(B);
        free(C_00);
        free(array);
        free(B_00);
        return 0xf;
      }
      if (NAN(dVar4)) {
        printf("Program Exiting as the function returns NaN");
        free(C);
        free(A);
        free(B);
        free(C_00);
        free(array);
        free(B_00);
        return 0xf;
      }
      if (lambdamin * 0.0001 * *C + dVar3 < dVar4) {
        if (stol / dVar2 <= lambdamin) {
          if ((lambdamin != 1.0) || (NAN(lambdamin))) {
            *A = 1.0 / (lambdamin * lambdamin);
            A[1] = -1.0 / (lambdatemp * lambdatemp);
            A[2] = -lambdatemp / (lambdamin * lambdamin);
            A[3] = lambdamin / (lambdatemp * lambdatemp);
            *B = -lambdamin * *C + (dVar4 - dVar3);
            B[1] = -lambdatemp * *C + (lambda2 - dVar3);
            mmult(A,B,C_00,2,2,1);
            scale(C_00,1,2,1.0 / (lambdamin - lambdatemp));
            if ((*C_00 != 0.0) || (NAN(*C_00))) {
              dVar1 = C_00[1];
              dVar5 = sqrt(C_00[1] * C_00[1] + -(*C_00 * 3.0 * *C));
              funcprev = (-dVar1 + dVar5) / (*C_00 * 3.0);
            }
            else {
              funcprev = -*C / (C_00[1] * 2.0);
            }
            if (lambdamin * 0.5 < funcprev) {
              funcprev = lambdamin * 0.5;
            }
          }
          else {
            funcprev = -*C / (((dVar4 - dVar3) - *C) * 2.0);
          }
          lambdatemp = lambdamin;
          lambda2 = dVar4;
          if (lambdamin * 0.1 < funcprev) {
            lambdamin = funcprev;
          }
          else {
            lambdamin = lambdamin * 0.1;
          }
        }
        else {
          iter = 1;
          for (MAXITER = 0; MAXITER < N; MAXITER = MAXITER + 1) {
            x[MAXITER] = xi[MAXITER];
          }
        }
      }
      else {
        iter = 0;
      }
    }
    free(C);
    free(A);
    free(B);
    free(C_00);
    free(array);
    free(B_00);
    funcpt_local._4_4_ = iter;
  }
  return funcpt_local._4_4_;
}

Assistant:

int lnsrch(custom_function *funcpt,double *xi,double *jac,double *p,int N,double * dx,double maxstep,double stol,double *x) {
	int retval,i,iter,MAXITER;
	double alpha,lambda,lambdamin,funcf,funci,lambdaprev,lambdatemp,funcprev;
	double lambda2,lambdaprev2,ll,den,rell,nlen;
	double *slopei,*temp1,*temp2,*ab,*rcheck,*pl;
	
	slopei = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *4);
	temp2 = (double*) malloc(sizeof(double) *2);
	ab = (double*) malloc(sizeof(double) *2);
	rcheck = (double*) malloc(sizeof(double) *N);
	pl = (double*) malloc(sizeof(double) *N);
	retval = 100;
	alpha = 1e-04;
	lambda = 1.0;
	nlen = 0.0;
	MAXITER = 1000;
	funcprev = 1.0; // funcprev and lambdaprev are initialized to suppress warnings
	lambdaprev = 1.0; // These values are not used as the program sets the value later on.
	for(i = 0; i < N;++i) {
		nlen += dx[i] * p[i] * dx[i] * p[i];
	}
	nlen = sqrt(nlen);
	iter = 0;
	if (nlen > maxstep) {
		scale(p,1,N,maxstep/nlen);
		nlen = maxstep;
	}
	
	mmult(jac,p,slopei,1,N,1);
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
			den = fabs(xi[i]);
		} else {
			den = 1.0 /fabs(dx[i]);
		}
		rcheck[i] = p[i]/den;
	}
	
	rell = array_max_abs(rcheck,N);
	
	lambdamin = stol/rell;
	
	//mdisplay(p,1,N);
	funci = FUNCPT_EVAL(funcpt, xi, N);
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(slopei);
		free(temp1);
		free(temp2);
		free(ab);
		free(rcheck);
		free(pl);
		return 15;
	}
	while (retval > 1 && iter < MAXITER) {
		iter++;
		for(i = 0; i < N;++i) {
			pl[i] = p[i] * lambda;
		}
		madd(xi,pl,x,1,N);
		funcf = FUNCPT_EVAL(funcpt, x, N);
		if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			return 15;
		}
		if (funcf != funcf) {
			printf("Program Exiting as the function returns NaN");
			free(slopei);
			free(temp1);
			free(temp2);
			free(ab);
			free(rcheck);
			free(pl);
			return 15;
		}

		//printf("lambda %g %g %g \n",funcf,funci,lambda);
		
		if (funcf <= funci + alpha *lambda *slopei[0]) {
			retval = 0;
		} else if (lambda < lambdamin) {
			retval = 1;
			for (i = 0; i < N;++i) {
				x[i] = xi[i]; // Check
			}
		} else {
			if (lambda == 1.0) {
				lambdatemp = - slopei[0] / (2.0 * (funcf - funci - slopei[0])); 
			} else {
				lambda2 = lambda * lambda;
				lambdaprev2 = lambdaprev * lambdaprev;
				ll = lambda - lambdaprev;
				temp1[0] = 1.0 / lambda2; temp1[1] = -1.0 /lambdaprev2;
				temp1[2] = - lambdaprev / lambda2; temp1[3] = lambda /lambdaprev2;
				temp2[0] = funcf - funci - lambda * slopei[0];
				temp2[1] = funcprev - funci - lambdaprev * slopei[0];
				mmult(temp1,temp2,ab,2,2,1);
				scale(ab,1,2,1.0/ll);
				if (ab[0] == 0.0) {
					lambdatemp = - slopei[0] / (2.0 * ab[1]);
				} else {
					lambdatemp = (-ab[1] + sqrt( ab[1] * ab[1] - 3.0 * ab[0] *slopei[0]))/ (3.0 * ab[0]);
				}
				
				if (lambdatemp > 0.5 * lambda) {
					lambdatemp = 0.5 * lambda;
				}
			}
			lambdaprev = lambda;
			funcprev = funcf;
			if (lambdatemp <= 0.1 * lambda) {
				lambda = 0.1 * lambda;
			} else {
				lambda = lambdatemp;
			}
		}
	
	}
	
	free(slopei);
	free(temp1);
	free(temp2);
	free(ab);
	free(rcheck);
	free(pl);
	return retval;
}